

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
ccs::ast::Import::resolveImports
          (Import *this,ImportResolver *importResolver,Loader *loader,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inProgress)

{
  string *__x;
  CcsTracer *pCVar1;
  char cVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ostream *poVar4;
  string asStack_1e8 [32];
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  ostringstream msg;
  
  __x = &this->location;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((inProgress->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (inProgress->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish,__x);
  if (_Var3._M_current ==
      (inProgress->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(inProgress,__x);
    local_1b8 = (code *)0x0;
    pcStack_1b0 = (code *)0x0;
    local_1c8._M_unused._M_object = (void *)0x0;
    local_1c8._8_8_ = 0;
    local_1c8._M_unused._M_object = operator_new(0x20);
    *(Loader **)local_1c8._M_unused._0_8_ = loader;
    *(Import **)((long)local_1c8._M_unused._0_8_ + 8) = this;
    *(ImportResolver **)((long)local_1c8._M_unused._0_8_ + 0x10) = importResolver;
    *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      **)((long)local_1c8._M_unused._0_8_ + 0x18) = inProgress;
    pcStack_1b0 = std::
                  _Function_handler<bool_(std::basic_istream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:35:9)>
                  ::_M_invoke;
    local_1b8 = std::
                _Function_handler<bool_(std::basic_istream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/src/parser/ast.cpp:35:9)>
                ::_M_manager;
    cVar2 = (**(code **)(*(long *)importResolver + 0x10))(importResolver,__x);
    std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(inProgress);
    if (cVar2 != '\0') {
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar4 = std::operator<<((ostream *)&msg,"Failed to resolve \'");
    poVar4 = std::operator<<(poVar4,(string *)__x);
    std::operator<<(poVar4,"\'! (User-provided resolver returned false.)");
    pCVar1 = loader->trace;
    std::__cxx11::stringbuf::str();
    (*pCVar1->_vptr_CcsTracer[5])(pCVar1,asStack_1e8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar4 = std::operator<<((ostream *)&msg,"Circular import detected involving \'");
    poVar4 = std::operator<<(poVar4,(string *)__x);
    std::operator<<(poVar4,"\'");
    pCVar1 = loader->trace;
    std::__cxx11::stringbuf::str();
    (*pCVar1->_vptr_CcsTracer[5])(pCVar1,asStack_1e8);
  }
  std::__cxx11::string::~string(asStack_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  return false;
}

Assistant:

bool Import::resolveImports(ImportResolver &importResolver, Loader &loader,
    std::vector<std::string> &inProgress) {
  bool result = false;
  if (std::find(inProgress.begin(), inProgress.end(), location) !=
      inProgress.end()) {
    std::ostringstream msg;
    msg << "Circular import detected involving '" << location << "'";
    loader.tracer().onParseError(msg.str());
  } else {
    inProgress.push_back(location);
    result = importResolver.resolve(location,
        [&](std::istream &stream) {
      return loader.parseCcsStream(stream, location,
          importResolver, inProgress, ast);
    });
    inProgress.pop_back();
    if (!result) {
      std::ostringstream msg;
      msg << "Failed to resolve '" << location
        << "'! (User-provided resolver returned false.)";
      loader.tracer().onParseError(msg.str());
    }
  }
  return result;
}